

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU
          (ModelBaseEKFFlexEstimatorIMU *this,double dt)

{
  uint uVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar2;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_228;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_218;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_1e8;
  Scalar local_1c8;
  Scalar local_1c0;
  Scalar local_1b8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_1b0;
  undefined1 local_190 [8];
  Matrix3 v;
  Vector3 v2;
  Vector3 v1;
  Vector x0;
  Scalar local_f8;
  Type local_f0;
  Scalar local_b8;
  Type local_b0;
  ConstantReturnType local_78;
  undefined1 local_60 [8];
  Vector dx;
  ConstantReturnType local_40;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  double local_18;
  double dt_local;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  local_18 = dt;
  dt_local = (double)this;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant(&local_40,0x23,1,&dxFactor);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_28,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_40);
  EKFFlexibilityEstimatorBase::EKFFlexibilityEstimatorBase
            (&this->super_EKFFlexibilityEstimatorBase,0x23,0xc,0x2a,(Vector *)&local_28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_28);
  (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
  _vptr_FlexibilityEstimatorBase = (_func_int **)&PTR__ModelBaseEKFFlexEstimatorIMU_006b3510;
  IMUElasticLocalFrameDynamicalSystem::IMUElasticLocalFrameDynamicalSystem(&this->functor_,local_18)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Q_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  this->stateSize_ = 0x23;
  this->unmodeledForceVariance_ = 1e-06;
  this->forceVariance_ = 0.0001;
  this->absPosVariance_ = 0.0001;
  this->useFTSensors_ = false;
  this->withComBias_ = false;
  this->withAbsolutePos_ = false;
  this->withUnmodeledForces_ = false;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->limitTorques_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->limitForces_);
  this->limitOn_ = true;
  optimization::optimization(&this->op_);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&this->contactPositions_);
  uVar1 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(&this->functor_);
  KalmanFilterBase::setMeasureSize
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,uVar1);
  KalmanFilterBase::setStateSize
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,this->stateSize_
            );
  uVar1 = IMUElasticLocalFrameDynamicalSystem::getInputSize(&this->functor_);
  ZeroDelayObserver::setInputSize
            ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,uVar1);
  uVar1 = IMUElasticLocalFrameDynamicalSystem::getInputSize(&this->functor_);
  this->inputSize_ = uVar1;
  resetCovarianceMatrices(this);
  uVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (&local_78,(ulong)uVar1,1,&dxFactor);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_60,&local_78);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_b0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_60,3,3);
  local_b8 = 0.0001;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::fill
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_b0,&local_b8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_f0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_60,9,3);
  local_f8 = 0.0001;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::fill
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_f0,&local_f8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_60);
  EKFFlexibilityEstimatorBase::useFiniteDifferencesJacobians
            (&this->super_EKFFlexibilityEstimatorBase,
             (Vector *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  ObserverBase::stateVectorZero
            ((ObserverBase *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            (&(this->super_EKFFlexibilityEstimatorBase).lastX_,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  ZeroDelayObserver::setState
            ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,
             (StateVector *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),0);
  KalmanFilterBase::setStateCovariance
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,&this->Q_);
  ExtendedKalmanFilter::setFunctor
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_,
             &(this->functor_).super_DynamicalSystemFunctorBase);
  IMUElasticLocalFrameDynamicalSystem::setFDstep
            (&this->functor_,&(this->super_EKFFlexibilityEstimatorBase).dx_);
  this->on_ = true;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_190);
  local_1b8 = 100.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_1b0,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),&local_1b8);
  local_1c0 = 100.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_1b0,&local_1c0);
  local_1c8 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_1c8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_1b0);
  local_1f0 = 10.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_1e8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 8),&local_1f0);
  local_1f8 = 10.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_1e8,&local_1f8);
  local_200 = 100.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_200);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_1e8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_190);
  local_208 = 556.64;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_190,&local_208);
  local_218 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_190,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2));
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)&this->limitForces_,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_218);
  local_228 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_190,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 8));
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)&this->limitTorques_,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_228);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_60);
  return;
}

Assistant:

ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU(double dt):
        EKFFlexibilityEstimatorBase
            (stateSize,measurementSizeBase_,inputSizeBase_,
                            Matrix::Constant(stateSize,1,dxFactor)),
        functor_(dt),
        stateSize_(stateSize),
        unmodeledForceVariance_(1e-6),
        forceVariance_(1e-4),
        absPosVariance_(1e-4),
        useFTSensors_(false),
        withAbsolutePos_(false),
        withComBias_(false),
        withUnmodeledForces_(false),
        limitOn_(true)
    {
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        ekf_.setStateSize(stateSize_);
        ekf_.setInputSize(functor_.getInputSize());
        inputSize_=functor_.getInputSize();

        ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices();

        Vector dx(Matrix::Constant(getStateSize(),1,dxFactor));

        dx.segment(state::ori,3).fill(1e-4) ;
        dx.segment(state::angVel,3).fill(1e-4) ;

        ModelBaseEKFFlexEstimatorIMU::useFiniteDifferencesJacobians(dx);

        Vector x0(ekf_.stateVectorZero());

        lastX_=x0;
        ekf_.setState(x0,0);

        ekf_.setStateCovariance(Q_);

        ekf_.setFunctor(& functor_);

        functor_.setFDstep(dx_);

        on_=true;

        Vector3 v1, v2;
        Matrix3 v;
        v1 << 100,
              100,
              1000;
        v2 << 10,
              10,
              100;
        v.setIdentity();
        v*=cst::gravityConstant*hrp2::m;
        limitForces_=v*v1;
        limitTorques_=v*v2;

    }